

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall duckdb::StringValueScanner::SetStart(StringValueScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *psVar1;
  CSVIterator *current_iterator;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  ulong uVar2;
  idx_t iVar3;
  idx_t iVar4;
  undefined8 uVar5;
  bool bVar6;
  CSVBufferHandle *pCVar7;
  CSVBufferManager *pCVar8;
  CSVStateMachineCache *this_01;
  CSVStateMachine *pCVar9;
  StateMachine *args_1;
  byte bVar10;
  idx_t iVar11;
  ValidRowInfo quoted_row;
  ValidRowInfo best_row;
  
  iVar11 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  this->start_pos =
       (this->super_BaseScanner).iterator.pos.buffer_idx *
       (this->super_BaseScanner).iterator.buffer_size + iVar11;
  if ((this->super_BaseScanner).iterator.first_one == true) {
    if ((this->result).store_line_size != true) {
      return;
    }
    CSVErrorHandler::NewMaxLineSize((this->result).error_handler,iVar11);
    return;
  }
  uVar2 = (this->super_BaseScanner).iterator.boundary.end_pos;
  this_00 = &(this->super_BaseScanner).cur_buffer_handle;
  pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
  if (pCVar7->actual_size < uVar2) {
    pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    (this->super_BaseScanner).iterator.boundary.end_pos = pCVar7->actual_size;
  }
  if ((this->state_machine_strict).internal.
      super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pCVar8 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                       (&(this->super_BaseScanner).buffer_manager);
    this_01 = CSVStateMachineCache::Get(pCVar8->context);
    psVar1 = &(this->super_BaseScanner).state_machine;
    pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
    CSVStateMachineOptions::CSVStateMachineOptions
              ((CSVStateMachineOptions *)&best_row,&pCVar9->state_machine_options);
    args_1 = CSVStateMachineCache::Get(this_01,(CSVStateMachineOptions *)&best_row);
    shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
    make_shared_ptr<duckdb::CSVStateMachine,duckdb::StateMachine_const&,duckdb::CSVReaderOptions_const&>
              ((StateMachine *)&quoted_row,(CSVReaderOptions *)args_1);
    shared_ptr<duckdb::CSVStateMachine,_true>::operator=
              (&this->state_machine_strict,(shared_ptr<duckdb::CSVStateMachine,_true> *)&quoted_row)
    ;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&quoted_row.start_pos);
    ::std::__cxx11::string::~string((string *)&best_row.start_pos);
  }
  current_iterator = &(this->super_BaseScanner).iterator;
  TryRow(&best_row,this,STANDARD_NEWLINE,(this->super_BaseScanner).iterator.pos.buffer_pos,
         (this->super_BaseScanner).iterator.boundary.end_pos);
  psVar1 = &(this->super_BaseScanner).state_machine;
  pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1);
  uVar5 = best_row._0_8_;
  if ((pCVar9->dialect_options).state_machine_options.quote.value != '\0') {
    iVar11 = (this->super_BaseScanner).iterator.boundary.end_pos;
    if (((best_row._0_8_ & 1) != 0) &&
       (best_row.end_buffer_idx == (current_iterator->pos).buffer_idx)) {
      iVar11 = best_row.end_pos;
    }
    TryRow(&quoted_row,this,QUOTED,(this->super_BaseScanner).iterator.pos.buffer_pos,iVar11);
    if (quoted_row.is_valid == true) {
      if (((uVar5 & 1) == 0) || (best_row.last_state_quote == true)) {
        best_row.last_state_quote = quoted_row.last_state_quote;
        best_row.is_valid = quoted_row.is_valid;
        best_row.end_buffer_idx = quoted_row.end_buffer_idx;
        best_row.end_pos = quoted_row.end_pos;
        best_row.start_pos = quoted_row.start_pos;
      }
      if (quoted_row.start_pos < best_row.start_pos) {
LAB_01ae47c9:
        best_row.last_state_quote = quoted_row.last_state_quote;
        best_row.is_valid = quoted_row.is_valid;
        best_row.end_buffer_idx = quoted_row.end_buffer_idx;
        best_row.end_pos = quoted_row.end_pos;
        best_row.start_pos = quoted_row.start_pos;
      }
    }
    else if (((uVar5 & 1) == 0) && (best_row.start_pos < quoted_row.start_pos)) goto LAB_01ae47c9;
  }
  bVar10 = best_row.is_valid;
  if (((((best_row.is_valid & 1U) == 0) &&
       (pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1),
       (pCVar9->dialect_options).state_machine_options.escape.value != '\0')) &&
      (pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(psVar1),
      (pCVar9->dialect_options).state_machine_options.quote.value != '\0')) &&
     ((TryRow(&quoted_row,this,ESCAPE,(this->super_BaseScanner).iterator.pos.buffer_pos,
              (this->super_BaseScanner).iterator.boundary.end_pos), quoted_row.is_valid != false ||
      (bVar10 = best_row.is_valid, best_row.start_pos < quoted_row.start_pos)))) {
    best_row.last_state_quote = quoted_row.last_state_quote;
    best_row.end_buffer_idx = quoted_row.end_buffer_idx;
    best_row.end_pos = quoted_row.end_pos;
    best_row.start_pos = quoted_row.start_pos;
    bVar10 = quoted_row.is_valid;
  }
  iVar11 = best_row.start_pos;
  if ((bVar10 & 1) == 0) {
    pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    if ((iVar11 < pCVar7->actual_size) ||
       (pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
       pCVar7->is_last_buffer != true)) {
      bVar6 = SkipUntilState(this,STANDARD_NEWLINE,RECORD_SEPARATOR,current_iterator,
                             &quoted_row.is_valid);
      if (!bVar6) {
        CSVIterator::CheckIfDone(current_iterator);
      }
      goto LAB_01ae48d3;
    }
    (this->super_BaseScanner).iterator.pos.buffer_pos = iVar11;
  }
  else {
    (this->super_BaseScanner).iterator.pos.buffer_pos = best_row.start_pos;
    pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    if ((iVar11 < pCVar7->actual_size) ||
       (pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
       pCVar7->is_last_buffer != true)) goto LAB_01ae48d3;
  }
  (this->super_BaseScanner).iterator.done = true;
LAB_01ae48d3:
  iVar11 = (this->super_BaseScanner).iterator.pos.buffer_idx;
  iVar3 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  iVar4 = (this->result).buffer_size;
  (this->result).super_ScannerResult.last_position.buffer_pos = iVar3;
  (this->result).super_ScannerResult.last_position.buffer_size = iVar4;
  (this->result).super_ScannerResult.last_position.buffer_idx = iVar11;
  this->start_pos = iVar11 * (this->super_BaseScanner).iterator.buffer_size + iVar3;
  return;
}

Assistant:

void StringValueScanner::SetStart() {
	start_pos = iterator.GetGlobalCurrentPos();
	if (iterator.first_one) {
		if (result.store_line_size) {
			result.error_handler.NewMaxLineSize(iterator.pos.buffer_pos);
		}
		return;
	}
	if (iterator.GetEndPos() > cur_buffer_handle->actual_size) {
		iterator.SetEnd(cur_buffer_handle->actual_size);
	}
	if (!state_machine_strict) {
		// We need to initialize our strict state machine
		auto &state_machine_cache = CSVStateMachineCache::Get(buffer_manager->context);
		auto state_options = state_machine->state_machine_options;
		// To set the state machine to be strict we ensure that strict_mode is set to true
		if (!state_options.strict_mode.IsSetByUser()) {
			state_options.strict_mode = true;
		}
		state_machine_strict =
		    make_shared_ptr<CSVStateMachine>(state_machine_cache.Get(state_options), state_machine->options);
	}
	// At this point we have 3 options:
	// 1. We are at the start of a valid line
	ValidRowInfo best_row = TryRow(CSVState::STANDARD_NEWLINE, iterator.pos.buffer_pos, iterator.GetEndPos());
	// 2. We are in the middle of a quoted value
	if (state_machine->dialect_options.state_machine_options.quote.GetValue() != '\0') {
		idx_t end_pos = iterator.GetEndPos();
		if (best_row.is_valid && best_row.end_buffer_idx == iterator.pos.buffer_idx) {
			// If we got a valid row from the standard state, we limit our search up to that.
			end_pos = best_row.end_pos;
		}
		auto quoted_row = TryRow(CSVState::QUOTED, iterator.pos.buffer_pos, end_pos);
		if (quoted_row.is_valid && (!best_row.is_valid || best_row.last_state_quote)) {
			best_row = quoted_row;
		}
		if (!best_row.is_valid && !quoted_row.is_valid && best_row.start_pos < quoted_row.start_pos) {
			best_row = quoted_row;
		}
		if (quoted_row.is_valid && quoted_row.start_pos < best_row.start_pos) {
			best_row = quoted_row;
		}
	}
	// 3. We are in an escaped value
	if (!best_row.is_valid && state_machine->dialect_options.state_machine_options.escape.GetValue() != '\0' &&
	    state_machine->dialect_options.state_machine_options.quote.GetValue() != '\0') {
		auto escape_row = TryRow(CSVState::ESCAPE, iterator.pos.buffer_pos, iterator.GetEndPos());
		if (escape_row.is_valid) {
			best_row = escape_row;
		} else {
			if (best_row.start_pos < escape_row.start_pos) {
				best_row = escape_row;
			}
		}
	}
	if (!best_row.is_valid) {
		bool is_this_the_end =
		    best_row.start_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer;
		if (is_this_the_end) {
			iterator.pos.buffer_pos = best_row.start_pos;
			iterator.done = true;
		} else {
			bool mock;
			if (!SkipUntilState(CSVState::STANDARD_NEWLINE, CSVState::RECORD_SEPARATOR, iterator, mock)) {
				iterator.CheckIfDone();
			}
		}
	} else {
		iterator.pos.buffer_pos = best_row.start_pos;
		bool is_this_the_end =
		    best_row.start_pos >= cur_buffer_handle->actual_size && cur_buffer_handle->is_last_buffer;
		if (is_this_the_end) {
			iterator.done = true;
		}
	}

	// 4. We have an error, if we have an error, we let life go on, the scanner will either ignore it
	// or throw.
	result.last_position = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, result.buffer_size};
	start_pos = iterator.GetGlobalCurrentPos();
}